

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lift.h
# Opt level: O0

LatticeComparison __thiscall
wasm::analysis::Lift<wasm::RandomLattice>::compare
          (Lift<wasm::RandomLattice> *this,Element *a,Element *b)

{
  bool bVar1;
  RandomElement<wasm::RandomLattice> *a_00;
  RandomElement<wasm::RandomLattice> *b_00;
  Element *b_local;
  Element *a_local;
  Lift<wasm::RandomLattice> *this_local;
  
  bVar1 = Element::isBottom(a);
  if ((bVar1) && (bVar1 = Element::isBottom(b), bVar1)) {
    this_local._4_4_ = EQUAL;
  }
  else {
    bVar1 = Element::isBottom(a);
    if (bVar1) {
      this_local._4_4_ = LESS;
    }
    else {
      bVar1 = Element::isBottom(b);
      if (bVar1) {
        this_local._4_4_ = GREATER;
      }
      else {
        a_00 = std::optional<wasm::RandomElement<wasm::RandomLattice>_>::operator*
                         (&a->super_optional<wasm::RandomElement<wasm::RandomLattice>_>);
        b_00 = std::optional<wasm::RandomElement<wasm::RandomLattice>_>::operator*
                         (&b->super_optional<wasm::RandomElement<wasm::RandomLattice>_>);
        this_local._4_4_ = RandomLattice::compare(&this->lattice,a_00,b_00);
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

LatticeComparison compare(const Element& a, const Element& b) const noexcept {
    if (a.isBottom() && b.isBottom()) {
      return EQUAL;
    } else if (a.isBottom()) {
      return LESS;
    } else if (b.isBottom()) {
      return GREATER;
    } else {
      return lattice.compare(*a, *b);
    }
  }